

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O0

uint32_t google::protobuf::internal::TcParseTableBase::RecodeTagForFastParsing(uint32_t tag)

{
  char *failure_msg;
  LogMessage *pLVar1;
  uint32_t hibits;
  LogMessage local_38;
  Voidify local_21;
  uint local_20;
  uint local_1c;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t tag_local;
  
  absl_log_internal_check_op_result._4_4_ = tag;
  local_1c = absl::lts_20250127::log_internal::GetReferenceableValue(tag);
  local_20 = absl::lts_20250127::log_internal::GetReferenceableValue(0x3fff);
  local_18 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_int,unsigned_int>
                       (&local_1c,&local_20,"tag <= 0x3FFFu");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_decl.h"
               ,0x179,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  if ((absl_log_internal_check_op_result._4_4_ & 0xffffff80) != 0) {
    absl_log_internal_check_op_result._4_4_ =
         absl_log_internal_check_op_result._4_4_ +
         (absl_log_internal_check_op_result._4_4_ & 0xffffff80) + 0x80;
  }
  return absl_log_internal_check_op_result._4_4_;
}

Assistant:

static uint32_t RecodeTagForFastParsing(uint32_t tag) {
    ABSL_DCHECK_LE(tag, 0x3FFFu);
    // Construct the varint-coded tag. If it is more than 7 bits, we need to
    // shift the high bits and add a continue bit.
    uint32_t hibits = tag & 0xFFFFFF80;
    if (hibits != 0) {
      // hi = tag & ~0x7F
      // lo = tag & 0x7F
      // This shifts hi to the left by 1 to the next byte and sets the
      // continuation bit.
      tag = tag + hibits + 0x80;
    }
    return tag;
  }